

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O1

void __thiscall
testing::internal::StreamingListener::OnTestPartResult
          (StreamingListener *this,TestPartResult *test_part_result)

{
  undefined8 *puVar1;
  size_type *psVar2;
  StreamingListener *pSVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  char **ppcVar8;
  char *in_RDX;
  StreamingListener *this_00;
  ulong uVar9;
  char *pcVar10;
  undefined8 uVar11;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  string local_110;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  char **local_d0;
  char *local_c8;
  char *local_c0;
  long lStack_b8;
  string local_b0;
  string local_90;
  int local_6c;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string local_48;
  
  pSVar3 = (StreamingListener *)(test_part_result->file_name_)._M_string_length;
  if (pSVar3 != (StreamingListener *)0x0) {
    pSVar3 = (StreamingListener *)(test_part_result->file_name_)._M_dataplus._M_p;
  }
  this_00 = (StreamingListener *)0x13df98;
  if (pSVar3 != (StreamingListener *)0x0) {
    this_00 = pSVar3;
  }
  UrlEncode_abi_cxx11_(&local_48,this_00,in_RDX);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x13f326);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_58 = *plVar6;
    lStack_50 = plVar4[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar6;
    local_68 = (long *)*plVar4;
  }
  local_60 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_e0 = *puVar7;
    lStack_d8 = plVar4[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar7;
    local_f0 = (ulong *)*plVar4;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_6c = test_part_result->line_number_;
  StreamableToString<int>(&local_90,&local_6c);
  uVar9 = 0xf;
  if (local_f0 != &local_e0) {
    uVar9 = local_e0;
  }
  if (uVar9 < local_90._M_string_length + local_e8) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar11 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_90._M_string_length + local_e8) goto LAB_00136367;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_00136367:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_90._M_dataplus._M_p);
  }
  local_130 = &local_120;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar5[3];
  }
  else {
    local_120 = *puVar1;
    local_130 = (undefined8 *)*puVar5;
  }
  local_128 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_130);
  ppcVar8 = (char **)(plVar4 + 2);
  if ((char **)*plVar4 == ppcVar8) {
    local_c0 = *ppcVar8;
    lStack_b8 = plVar4[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *ppcVar8;
    local_d0 = (char **)*plVar4;
  }
  local_c8 = (char *)plVar4[1];
  *plVar4 = (long)ppcVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  UrlEncode_abi_cxx11_
            (&local_b0,(StreamingListener *)(test_part_result->message_)._M_dataplus._M_p,local_c8);
  pcVar10 = (char *)0xf;
  if (local_d0 != &local_c0) {
    pcVar10 = local_c0;
  }
  if (pcVar10 < local_c8 + local_b0._M_string_length) {
    uVar11 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar11 = local_b0.field_2._M_allocated_capacity;
    }
    if (local_c8 + local_b0._M_string_length <= (ulong)uVar11) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
      goto LAB_001364ab;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0._M_dataplus._M_p);
LAB_001364ab:
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  psVar2 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_110.field_2._M_allocated_capacity = *psVar2;
    local_110.field_2._8_8_ = puVar5[3];
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar2;
    local_110._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_110._M_string_length = puVar5[1];
  *puVar5 = psVar2;
  puVar5[1] = 0;
  *(undefined1 *)psVar2 = 0;
  AbstractSocketWriter::SendLn
            ((this->socket_writer_)._M_t.
             super___uniq_ptr_impl<testing::internal::StreamingListener::AbstractSocketWriter,_std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>_>
             ._M_t.
             super__Tuple_impl<0UL,_testing::internal::StreamingListener::AbstractSocketWriter_*,_std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>_>
             .
             super__Head_base<0UL,_testing::internal::StreamingListener::AbstractSocketWriter_*,_false>
             ._M_head_impl,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void OnTestPartResult(const TestPartResult& test_part_result) override {
    const char* file_name = test_part_result.file_name();
    if (file_name == nullptr) file_name = "";
    SendLn("event=TestPartResult&file=" + UrlEncode(file_name) +
           "&line=" + StreamableToString(test_part_result.line_number()) +
           "&message=" + UrlEncode(test_part_result.message()));
  }